

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
::val(FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
      *this)

{
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar5;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->right_->fadexpr_).left_;
  pFVar3 = (this->right_->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  return (((double)(pFVar1->fadexpr_).left_.constant_ + ((pFVar1->fadexpr_).right_)->val_) -
         ((this->left_->fadexpr_).right_)->val_) -
         (((pFVar2->fadexpr_).left_)->val_ * ((pFVar2->fadexpr_).right_)->val_) /
         (((double)(pFVar5->fadexpr_).left_.constant_ + ((pFVar5->fadexpr_).right_)->val_) *
         ((double)(pFVar4->fadexpr_).left_.constant_ + ((pFVar4->fadexpr_).right_)->val_));
}

Assistant:

const value_type val() const {return left_.val() - right_.val();}